

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O3

uint xmlRandom(void)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  
  puVar2 = xmlGetLocalRngState();
  uVar1 = *puVar2;
  uVar3 = puVar2[1] ^ uVar1;
  *puVar2 = uVar3 << 9 ^ (uVar1 << 0x1a | uVar1 >> 6) ^ uVar3;
  puVar2[1] = uVar3 << 0xd | uVar3 >> 0x13;
  return (uVar1 * -0x61c88645 >> 0x1b | uVar1 * -0x3910c8a0) * 5;
}

Assistant:

unsigned
xmlRandom(void) {
#ifdef LIBXML_THREAD_ENABLED
    return(xoroshiro64ss(xmlGetLocalRngState()));
#else
    return(xmlGlobalRandom());
#endif
}